

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket_p.cpp
# Opt level: O0

int64_t __thiscall BamTools::Internal::TcpSocket::Read(TcpSocket *this,char *data,uint numBytes)

{
  bool bVar1;
  size_t sVar2;
  int64_t iVar3;
  size_t in_RDI;
  RollingBuffer *unaff_retaddr;
  size_t numBytesRead;
  int64_t socketBytesRead;
  size_t bytesRead;
  TcpSocket *in_stack_ffffffffffffffd8;
  char *in_stack_fffffffffffffff8;
  
  sVar2 = in_RDI;
  bVar1 = RollingBuffer::IsEmpty((RollingBuffer *)(in_RDI + 0x80));
  if (bVar1) {
    if (*(long *)(in_RDI + 0x70) == 0) {
      sVar2 = 0xffffffffffffffff;
    }
    else {
      iVar3 = ReadFromSocket(in_stack_ffffffffffffffd8);
      if (iVar3 < 0) {
        sVar2 = 0xffffffffffffffff;
      }
      else {
        sVar2 = RollingBuffer::Read(unaff_retaddr,in_stack_fffffffffffffff8,sVar2);
      }
    }
  }
  else {
    sVar2 = RollingBuffer::Read(unaff_retaddr,in_stack_fffffffffffffff8,sVar2);
  }
  return sVar2;
}

Assistant:

int64_t TcpSocket::Read(char* data, const unsigned int numBytes) {

    // if we have data in buffer, just return it
    if ( !m_readBuffer.IsEmpty() ) {
        const size_t bytesRead = m_readBuffer.Read(data, numBytes);
        return static_cast<int64_t>(bytesRead);
    }

    // otherwise, we'll need to fetch data from socket
    // first make sure we have a valid socket engine
    if ( m_engine == 0 ) {
        // TODO: set error string/state?
        return -1;
    }

    // fetch data from socket, return 0 for success, -1 for failure
    // since this should be called in a loop,
    // we'll pull the actual bytes from the buffer on next iteration
    const int64_t socketBytesRead = ReadFromSocket();
    if ( socketBytesRead < 0 ) {
        // TODO: set error string/state ?
        return -1;
    }

    // we should have data now in buffer, try to fetch requested amount
    // if nothing in buffer, we will return 0 bytes read (signals EOF reached)
    const size_t numBytesRead = m_readBuffer.Read(data, numBytes);
    return static_cast<int64_t>(numBytesRead);
}